

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void __thiscall
VectorFormatter<DefaultFormatter>::
Unser<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>,std::vector<CAddress,std::allocator<CAddress>>>
          (VectorFormatter<DefaultFormatter> *this,
          ParamsStream<HashVerifier<AutoFile>_&,_CAddress::SerParams> *s,
          vector<CAddress,_std::allocator<CAddress>_> *v)

{
  long lVar1;
  uint64_t uVar2;
  ulong uVar3;
  uint64_t __n;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CAddress,_std::allocator<CAddress>_>::_M_erase_at_end
            (v,(v->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
               super__Vector_impl_data._M_start);
  uVar2 = ReadCompactSize<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>>(s,true);
  if (uVar2 != 0) {
    __n = 0;
    do {
      uVar3 = __n + 0x15cc5;
      __n = uVar2;
      if (uVar3 < uVar2) {
        __n = uVar3;
      }
      std::vector<CAddress,_std::allocator<CAddress>_>::reserve(v,__n);
      while ((ulong)(((long)(v->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(v->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7) < __n) {
        std::vector<CAddress,_std::allocator<CAddress>_>::emplace_back<>(v);
        CAddress::
        SerializationOps<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>,CAddress,ActionUnserialize>
                  ((v->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                   super__Vector_impl_data._M_finish + -1,s);
      }
    } while (uVar3 < uVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unser(Stream& s, V& v)
    {
        Formatter formatter;
        v.clear();
        size_t size = ReadCompactSize(s);
        size_t allocated = 0;
        while (allocated < size) {
            // For DoS prevention, do not blindly allocate as much as the stream claims to contain.
            // Instead, allocate in 5MiB batches, so that an attacker actually needs to provide
            // X MiB of data to make us allocate X+5 Mib.
            static_assert(sizeof(typename V::value_type) <= MAX_VECTOR_ALLOCATE, "Vector element size too large");
            allocated = std::min(size, allocated + MAX_VECTOR_ALLOCATE / sizeof(typename V::value_type));
            v.reserve(allocated);
            while (v.size() < allocated) {
                v.emplace_back();
                formatter.Unser(s, v.back());
            }
        }
    }